

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int luaK_numberK(FuncState *fs,lua_Number r)

{
  int iVar1;
  TValue *key;
  lua_Integer ik;
  TValue o;
  TValue kv;
  
  o.tt_ = '\x13';
  o.value_.n = r;
  iVar1 = luaV_flttointeger(r,&ik,F2Ieq);
  if (iVar1 == 0) {
    key = &o;
  }
  else {
    kv.value_.n = ldexp(1.0,-0x34);
    if (ik != 0) {
      kv.value_.n = kv.value_.n * r + r;
    }
    key = &kv;
    kv.tt_ = '\x13';
  }
  iVar1 = addk(fs,key,&o);
  return iVar1;
}

Assistant:

static int luaK_numberK (FuncState *fs, lua_Number r) {
  TValue o;
  lua_Integer ik;
  setfltvalue(&o, r);
  if (!luaV_flttointeger(r, &ik, F2Ieq))  /* not an integral value? */
    return addk(fs, &o, &o);  /* use number itself as key */
  else {  /* must build an alternative key */
    const int nbm = l_floatatt(MANT_DIG);
    const lua_Number q = l_mathop(ldexp)(l_mathop(1.0), -nbm + 1);
    const lua_Number k = (ik == 0) ? q : r + r*q;  /* new key */
    TValue kv;
    setfltvalue(&kv, k);
    /* result is not an integral value, unless value is too large */
    lua_assert(!luaV_flttointeger(k, &ik, F2Ieq) ||
                l_mathop(fabs)(r) >= l_mathop(1e6));
    return addk(fs, &kv, &o);
  }
}